

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

ostream * despot::operator<<(ostream *os,SearchStatistics *statistics)

{
  ostream *poVar1;
  long *plVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Initial bounds: (",0x11);
  poVar1 = std::ostream::_M_insert<double>(statistics->initial_lb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(statistics->initial_ub);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"Final bounds: (",0xf);
  poVar1 = std::ostream::_M_insert<double>(statistics->final_lb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>(statistics->final_ub);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"Time (CPU s): path / expansion / backup / total = ",0x32);
  poVar1 = std::ostream::_M_insert<double>(statistics->time_path);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," / ",3);
  poVar1 = std::ostream::_M_insert<double>(statistics->time_node_expansion);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," / ",3);
  poVar1 = std::ostream::_M_insert<double>(statistics->time_backup);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," / ",3);
  poVar1 = std::ostream::_M_insert<double>(statistics->time_search);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"Trials: no. / max length = ",0x1b);
  poVar1 = (ostream *)std::ostream::operator<<(os,statistics->num_trials);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," / ",3);
  plVar2 = (long *)std::ostream::operator<<(poVar1,statistics->longest_trial_length);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# nodes: expanded / total / policy = ",0x25);
  poVar1 = (ostream *)std::ostream::operator<<(os,statistics->num_expanded_nodes);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," / ",3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->num_tree_nodes);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," / ",3);
  plVar2 = (long *)std::ostream::operator<<(poVar1,statistics->num_policy_nodes);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (os,"# particles: initial / final / tree = ",0x26);
  poVar1 = (ostream *)std::ostream::operator<<(os,statistics->num_particles_before_search);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," / ",3);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,statistics->num_particles_after_search);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," / ",3);
  std::ostream::operator<<(poVar1,statistics->num_tree_particles);
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const SearchStatistics& statistics) {
	os << "Initial bounds: (" << statistics.initial_lb << ", "
		<< statistics.initial_ub << ")" << endl;
	os << "Final bounds: (" << statistics.final_lb << ", "
		<< statistics.final_ub << ")" << endl;
	os << "Time (CPU s): path / expansion / backup / total = "
		<< statistics.time_path << " / " << statistics.time_node_expansion
		<< " / " << statistics.time_backup << " / " << statistics.time_search
		<< endl;
	os << "Trials: no. / max length = " << statistics.num_trials << " / "
		<< statistics.longest_trial_length << endl;
	os << "# nodes: expanded / total / policy = "
		<< statistics.num_expanded_nodes << " / " << statistics.num_tree_nodes
		<< " / " << statistics.num_policy_nodes << endl;
	os << "# particles: initial / final / tree = "
		<< statistics.num_particles_before_search << " / "
		<< statistics.num_particles_after_search << " / "
		<< statistics.num_tree_particles; // << endl;
	return os;
}